

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Point3fi * __thiscall pbrt::Transform::operator()(Transform *this,Point3fi *p)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  float *pfVar4;
  Point3fi *in_RDI;
  span<const_float> *psVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [56];
  Vector3f VVar15;
  Vector3f pInError;
  Vector3f pError;
  Float wp;
  Float zp;
  Float yp;
  Float xp;
  Float z;
  Float y;
  Float x;
  float in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb34;
  float in_stack_fffffffffffffb40;
  float in_stack_fffffffffffffb44;
  float in_stack_fffffffffffffb48;
  float in_stack_fffffffffffffb4c;
  float in_stack_fffffffffffffb50;
  uint in_stack_fffffffffffffb54;
  float in_stack_fffffffffffffb6c;
  float in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  Point3<pbrt::Interval<float>_> local_39c;
  span<const_float> local_378;
  span<const_float> local_368;
  span<const_float> local_358;
  span<const_float> local_348;
  span<const_float> local_338;
  span<const_float> local_328;
  span<const_float> local_318;
  span<const_float> local_308;
  span<const_float> local_2f8;
  span<const_float> local_2e8;
  span<const_float> local_2d8;
  span<const_float> local_2c8;
  span<const_float> local_2b8;
  span<const_float> local_2a8;
  span<const_float> local_298;
  span<const_float> local_288;
  span<const_float> local_278;
  span<const_float> local_268;
  span<const_float> local_258;
  span<const_float> local_248;
  span<const_float> local_238;
  undefined8 local_228;
  float local_220;
  undefined8 local_214;
  float local_20c;
  span<const_float> local_208;
  span<const_float> local_1f8;
  span<const_float> local_1e8;
  span<const_float> local_1d8;
  span<const_float> local_1c8;
  span<const_float> local_1b8;
  span<const_float> local_1a8;
  span<const_float> local_198;
  span<const_float> local_188;
  span<const_float> local_178;
  span<const_float> local_168;
  span<const_float> local_158;
  float local_144;
  float local_140;
  float local_13c;
  span<const_float> local_138;
  span<const_float> local_128;
  span<const_float> local_118;
  span<const_float> local_108;
  float local_f4;
  span<const_float> local_f0;
  span<const_float> local_e0;
  span<const_float> local_d0;
  span<const_float> local_c0;
  float local_ac;
  span<const_float> local_a8;
  span<const_float> local_98;
  span<const_float> local_88;
  span<const_float> local_78;
  float local_64;
  span<const_float> local_60;
  span<const_float> local_50;
  span<const_float> local_40;
  span<const_float> local_30;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  local_14 = Interval::operator_cast_to_float((Interval<float> *)0x46ce14);
  local_18 = Interval::operator_cast_to_float((Interval<float> *)0x46ce2e);
  local_1c = Interval::operator_cast_to_float((Interval<float> *)0x46ce48);
  local_30 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_30,0);
  fVar6 = local_14;
  fVar9 = *pfVar4;
  local_40 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_40,1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),
                           ZEXT416((uint)(*pfVar4 * local_18)));
  local_50 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_50,2);
  fVar6 = local_1c;
  fVar9 = *pfVar4;
  local_60 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_60,3);
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),ZEXT416((uint)*pfVar4));
  local_20 = auVar1._0_4_ + auVar12._0_4_;
  local_78 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_78,0);
  fVar6 = local_14;
  fVar9 = *pfVar4;
  local_88 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_88,1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),
                           ZEXT416((uint)(*pfVar4 * local_18)));
  local_98 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_98,2);
  fVar6 = local_1c;
  fVar9 = *pfVar4;
  local_a8 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_a8,3);
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),ZEXT416((uint)*pfVar4));
  local_64 = auVar1._0_4_ + auVar12._0_4_;
  local_c0 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_c0,0);
  fVar6 = local_14;
  fVar9 = *pfVar4;
  local_d0 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_d0,1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),
                           ZEXT416((uint)(*pfVar4 * local_18)));
  local_e0 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_e0,2);
  fVar6 = local_1c;
  fVar9 = *pfVar4;
  local_f0 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                        (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_f0,3);
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),ZEXT416((uint)*pfVar4));
  local_ac = auVar1._0_4_ + auVar12._0_4_;
  local_108 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_108,0);
  fVar6 = local_14;
  fVar9 = *pfVar4;
  local_118 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_118,1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),
                           ZEXT416((uint)(*pfVar4 * local_18)));
  local_128 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_128,2);
  fVar6 = local_1c;
  fVar9 = *pfVar4;
  local_138 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         (int)in_stack_fffffffffffffb2c);
  pfVar4 = pstd::span<const_float>::operator[](&local_138,3);
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar9),ZEXT416((uint)*pfVar4));
  local_f4 = auVar1._0_4_ + auVar12._0_4_;
  auVar13 = ZEXT464((uint)local_f4);
  Vector3<float>::Vector3((Vector3<float> *)0x46d3fe);
  bVar3 = Point3fi::IsExact((Point3fi *)
                            CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  auVar14 = auVar13._8_56_;
  if (bVar3) {
    dVar10 = pbrt::gamma(auVar13._0_8_);
    local_158 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_158;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    fVar6 = *pfVar4 * local_14;
    std::abs((int)psVar5);
    local_168 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_168;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar7 = *pfVar4 * local_18;
    std::abs((int)psVar5);
    local_178 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_178;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    fVar8 = *pfVar4 * local_1c;
    std::abs((int)psVar5);
    local_188 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_188;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,3);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    local_144 = SUB84(dVar10,0) * (fVar6 + fVar7 + fVar8 + fVar9);
    dVar10 = pbrt::gamma((double)(ulong)(uint)local_144);
    local_198 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_198;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    fVar6 = *pfVar4 * local_14;
    std::abs((int)psVar5);
    local_1a8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_1a8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar7 = *pfVar4 * local_18;
    std::abs((int)psVar5);
    local_1b8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_1b8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    fVar8 = *pfVar4 * local_1c;
    std::abs((int)psVar5);
    local_1c8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_1c8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,3);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    local_140 = SUB84(dVar10,0) * (fVar6 + fVar7 + fVar8 + fVar9);
    dVar10 = pbrt::gamma((double)(ulong)(uint)local_140);
    local_1d8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_1d8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    fVar6 = *pfVar4 * local_14;
    std::abs((int)psVar5);
    local_1e8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_1e8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar7 = *pfVar4 * local_18;
    std::abs((int)psVar5);
    local_1f8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_1f8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    fVar8 = *pfVar4 * local_1c;
    std::abs((int)psVar5);
    local_208 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_208;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,3);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    local_13c = SUB84(dVar10,0) * (fVar6 + fVar7 + fVar8 + fVar9);
  }
  else {
    VVar15 = Point3fi::Error((Point3fi *)
                             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    local_220 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar13._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar13._8_56_ = auVar14;
    local_228 = vmovlpd_avx(auVar13._0_16_);
    local_214 = local_228;
    local_20c = local_220;
    dVar10 = pbrt::gamma(auVar13._0_8_);
    in_stack_fffffffffffffb50 = SUB84(dVar10,0) + 1.0;
    local_238 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_238;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    in_stack_fffffffffffffb34 = *pfVar4;
    std::abs((int)psVar5);
    uVar2 = (uint)local_214;
    local_248 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_248;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416((uint)in_stack_fffffffffffffb34),
                             ZEXT416((uint)(fVar9 * local_214._4_4_)));
    local_258 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_258;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    auVar12 = ZEXT416((uint)*pfVar4);
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_20c),auVar12,ZEXT416(auVar1._0_4_));
    in_stack_fffffffffffffb54 = auVar1._0_4_;
    dVar10 = pbrt::gamma(auVar1._0_8_);
    in_stack_fffffffffffffb4c = SUB84(dVar10,0);
    local_268 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_268;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    in_stack_fffffffffffffb40 = *pfVar4 * local_14;
    std::abs((int)psVar5);
    local_278 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_278;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    in_stack_fffffffffffffb44 = *pfVar4 * local_18;
    std::abs((int)psVar5);
    in_stack_fffffffffffffb44 = in_stack_fffffffffffffb40 + in_stack_fffffffffffffb44;
    local_288 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_288;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    in_stack_fffffffffffffb48 = *pfVar4 * local_1c;
    std::abs((int)psVar5);
    in_stack_fffffffffffffb48 = in_stack_fffffffffffffb44 + in_stack_fffffffffffffb48;
    local_298 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_298;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,3);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416(in_stack_fffffffffffffb54),
                             ZEXT416((uint)in_stack_fffffffffffffb50),
                             ZEXT416((uint)(in_stack_fffffffffffffb4c *
                                           (in_stack_fffffffffffffb48 + fVar9))));
    local_144 = auVar1._0_4_;
    dVar10 = pbrt::gamma(auVar1._0_8_);
    in_stack_fffffffffffffb74 = SUB84(dVar10,0) + 1.0;
    local_2a8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_2a8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    uVar2 = (uint)local_214;
    local_2b8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_2b8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar6 = *pfVar4;
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416((uint)fVar9),
                             ZEXT416((uint)(fVar6 * local_214._4_4_)));
    local_2c8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_2c8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    auVar12 = ZEXT416((uint)*pfVar4);
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_20c),auVar12,ZEXT416(auVar1._0_4_));
    dVar10 = pbrt::gamma(auVar1._0_8_);
    in_stack_fffffffffffffb70 = SUB84(dVar10,0);
    local_2d8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_2d8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    fVar9 = *pfVar4 * local_14;
    std::abs((int)psVar5);
    local_2e8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_2e8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar6 = *pfVar4 * local_18;
    std::abs((int)psVar5);
    local_2f8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_2f8;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    in_stack_fffffffffffffb6c = *pfVar4 * local_1c;
    std::abs((int)psVar5);
    in_stack_fffffffffffffb6c = fVar9 + fVar6 + in_stack_fffffffffffffb6c;
    local_308 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_308;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,3);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416(auVar1._0_4_),ZEXT416((uint)in_stack_fffffffffffffb74),
                             ZEXT416((uint)(in_stack_fffffffffffffb70 *
                                           (in_stack_fffffffffffffb6c + fVar9))));
    local_140 = auVar1._0_4_;
    dVar10 = pbrt::gamma(auVar1._0_8_);
    local_318 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_318;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    uVar2 = (uint)local_214;
    local_328 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_328;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar6 = *pfVar4;
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416((uint)fVar9),
                             ZEXT416((uint)(fVar6 * local_214._4_4_)));
    local_338 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_338;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    auVar12 = ZEXT416((uint)*pfVar4);
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_20c),auVar12,ZEXT416(auVar1._0_4_));
    dVar11 = pbrt::gamma(auVar1._0_8_);
    local_348 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_348;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,0);
    fVar6 = *pfVar4 * local_14;
    std::abs((int)psVar5);
    local_358 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_358;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,1);
    fVar7 = *pfVar4 * local_18;
    std::abs((int)psVar5);
    local_368 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_368;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,2);
    fVar8 = *pfVar4 * local_1c;
    std::abs((int)psVar5);
    local_378 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           (int)in_stack_fffffffffffffb2c);
    psVar5 = &local_378;
    pfVar4 = pstd::span<const_float>::operator[](psVar5,3);
    fVar9 = *pfVar4;
    std::abs((int)psVar5);
    auVar1 = vfmadd213ss_fma(ZEXT416(auVar1._0_4_),ZEXT416((uint)(SUB84(dVar10,0) + 1.0)),
                             ZEXT416((uint)(SUB84(dVar11,0) * (fVar6 + fVar7 + fVar8 + fVar9))));
    local_13c = auVar1._0_4_;
  }
  if ((local_f4 != 1.0) || (NAN(local_f4))) {
    Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28,0.0);
    Point3fi::Point3fi((Point3fi *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       (Point3f *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                       (Vector3f *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    Tuple3<pbrt::Point3,pbrt::Interval<float>>::operator/
              ((Tuple3<pbrt::Point3,_pbrt::Interval<float>_> *)
               CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb6c);
    Point3fi::Point3fi<float>(in_RDI,&local_39c);
  }
  else {
    Point3<float>::Point3
              ((Point3<float> *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28,0.0);
    Point3fi::Point3fi((Point3fi *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                       (Point3f *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                       (Vector3f *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    Point3fi operator()(const Point3fi &p) const {
        Float x = Float(p.x), y = Float(p.y), z = Float(p.z);
        // Compute transformed coordinates from point _pt_
        Float xp = (m[0][0] * x + m[0][1] * y) + (m[0][2] * z + m[0][3]);
        Float yp = (m[1][0] * x + m[1][1] * y) + (m[1][2] * z + m[1][3]);
        Float zp = (m[2][0] * x + m[2][1] * y) + (m[2][2] * z + m[2][3]);
        Float wp = (m[3][0] * x + m[3][1] * y) + (m[3][2] * z + m[3][3]);

        // Compute absolute error for transformed point, _pError_
        Vector3f pError;
        if (p.IsExact()) {
            // Compute error for transformed exact _p_
            pError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));

        } else {
            // Compute error for transformed approximate _p_
            Vector3f pInError = p.Error();
            pError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * pInError.x +
                                         std::abs(m[0][1]) * pInError.y +
                                         std::abs(m[0][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                   std::abs(m[0][2] * z) + std::abs(m[0][3]));
            pError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * pInError.x +
                                         std::abs(m[1][1]) * pInError.y +
                                         std::abs(m[1][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                   std::abs(m[1][2] * z) + std::abs(m[1][3]));
            pError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * pInError.x +
                                         std::abs(m[2][1]) * pInError.y +
                                         std::abs(m[2][2]) * pInError.z) +
                       gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                   std::abs(m[2][2] * z) + std::abs(m[2][3]));
        }

        if (wp == 1)
            return Point3fi(Point3f(xp, yp, zp), pError);
        else
            return Point3fi(Point3f(xp, yp, zp), pError) / wp;
    }